

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  Mode MVar1;
  ulong uVar2;
  char *pcVar3;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDX;
  string *in_RSI;
  Mode *in_RDI;
  size_t unaff_retaddr;
  Parser *in_stack_00000008;
  char c;
  size_t i;
  ulong local_20;
  Mode *pMVar4;
  
  local_20 = 0;
  pMVar4 = in_RDI;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 < local_20) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar3 == '\"') {
      *(undefined1 *)(in_RDI + 4) = ((char)in_RDI[4] ^ 0xff) & MaybeShortOpt;
    }
    MVar1 = handleMode(in_stack_00000008,unaff_retaddr,(char)((ulong)pMVar4 >> 0x38),in_RSI,in_RDX);
    *in_RDI = MVar1;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void parseIntoTokens( std::string const& arg, std::vector<Token>& tokens ) {
            for( std::size_t i = 0; i <= arg.size(); ++i ) {
                char c = arg[i];
                if( c == '"' )
                    inQuotes = !inQuotes;
                mode = handleMode( i, c, arg, tokens );
            }
        }